

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O1

Status __thiscall
leveldb::log::LogTest::StringSource::Read(StringSource *this,size_t n,Slice *result,char *scratch)

{
  size_t sVar1;
  char *in_R9;
  AssertionResult gtest_ar_;
  Slice local_78;
  char *local_68;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_60;
  AssertHelper local_58;
  string local_50;
  
  local_78.data_ = (char *)(CONCAT71(local_78.data_._1_7_,*(char *)(n + 0x19)) ^ 1);
  local_78.size_ = 0;
  if (*(char *)(n + 0x19) != '\0') {
    local_68 = scratch;
    testing::Message::Message((Message *)&local_60);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_60._M_head_impl + 0x10),"must not Read() after eof/error",0x1f);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_50,(internal *)&local_78,(AssertionResult *)"!returned_partial_","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/log_test.cc"
               ,0xb4,local_50._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    scratch = local_68;
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
      scratch = local_68;
    }
  }
  sVar1 = local_78.size_;
  if ((undefined8 *)local_78.size_ != (undefined8 *)0x0) {
    if (*(undefined8 **)local_78.size_ != (undefined8 *)(local_78.size_ + 0x10)) {
      operator_delete(*(undefined8 **)local_78.size_);
    }
    operator_delete((void *)sVar1);
  }
  if (*(char *)(n + 0x18) == '\x01') {
    *(undefined2 *)(n + 0x18) = 0x100;
    local_50._M_dataplus._M_p = "read error";
    local_50._M_string_length = 10;
    local_78.data_ = "";
    local_78.size_ = 0;
    Status::Status((Status *)this,kCorruption,(Slice *)&local_50,&local_78);
  }
  else {
    if (*(Slice **)(n + 0x10) < result) {
      *(undefined1 *)(n + 0x19) = 1;
      result = *(Slice **)(n + 0x10);
    }
    *(undefined8 *)scratch = *(undefined8 *)(n + 8);
    *(Slice **)(scratch + 8) = result;
    if (*(Slice **)(n + 0x10) < result) {
      __assert_fail("n <= size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/include/leveldb/slice.h"
                    ,0x45,"void leveldb::Slice::remove_prefix(size_t)");
    }
    *(long *)(n + 8) = (long)&result->data_ + *(long *)(n + 8);
    *(long *)(n + 0x10) = (long)*(Slice **)(n + 0x10) - (long)result;
    (this->super_SequentialFile)._vptr_SequentialFile = (_func_int **)0x0;
  }
  return (Status)(char *)this;
}

Assistant:

Status Read(size_t n, Slice* result, char* scratch) override {
      EXPECT_TRUE(!returned_partial_) << "must not Read() after eof/error";

      if (force_error_) {
        force_error_ = false;
        returned_partial_ = true;
        return Status::Corruption("read error");
      }

      if (contents_.size() < n) {
        n = contents_.size();
        returned_partial_ = true;
      }
      *result = Slice(contents_.data(), n);
      contents_.remove_prefix(n);
      return Status::OK();
    }